

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O1

string * __thiscall
duckdb::MaterializedQueryResult::ToString_abi_cxx11_
          (string *__return_storage_ptr__,MaterializedQueryResult *this)

{
  ulong __val;
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var2;
  char cVar3;
  bool bVar4;
  pointer pCVar5;
  long *plVar6;
  ColumnDataCollection *pCVar7;
  ColumnDataRow *this_00;
  ulong uVar8;
  size_type *psVar9;
  char cVar10;
  idx_t column_index;
  ColumnDataRowIterator __begin2;
  Value val;
  ColumnDataRowIterator __end2;
  string local_260;
  string local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  ColumnDataRowIterationHelper local_218;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [112];
  pointer local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  Value local_120;
  undefined1 local_e0 [24];
  __node_base _Stack_c8;
  pointer local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  
  local_220 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_220;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->super_QueryResult).super_BaseQueryResult.success == true) {
    QueryResult::HeaderToString_abi_cxx11_((string *)local_1d0,&this->super_QueryResult);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1d0);
    pcVar1 = local_1d0 + 0x10;
    if ((pointer)local_1d0._0_8_ != pcVar1) {
      operator_delete((void *)local_1d0._0_8_);
    }
    pCVar5 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    __val = pCVar5->count;
    cVar10 = '\x01';
    if (9 < __val) {
      uVar8 = __val;
      cVar3 = '\x04';
      do {
        cVar10 = cVar3;
        if (uVar8 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_00fcafb0;
        }
        if (uVar8 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_00fcafb0;
        }
        if (uVar8 < 10000) goto LAB_00fcafb0;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar10 + '\x04';
      } while (bVar4);
      cVar10 = cVar10 + '\x01';
    }
LAB_00fcafb0:
    pp_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_120.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_120.type_._0_8_ = pp_Var2;
    ::std::__cxx11::string::_M_construct((ulong)&local_120,cVar10);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_120.type_._0_8_,
               (uint)local_120.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               __val);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x1e13bb5);
    pCVar7 = (ColumnDataCollection *)(plVar6 + 2);
    if ((ColumnDataCollection *)*plVar6 == pCVar7) {
      local_e0._16_8_ =
           (pCVar7->allocator).internal.
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Stack_c8._M_nxt = (_Hash_node_base *)plVar6[3];
      local_e0._0_8_ = (ColumnDataCollection *)(local_e0 + 0x10);
    }
    else {
      local_e0._16_8_ =
           (pCVar7->allocator).internal.
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e0._0_8_ = (ColumnDataCollection *)*plVar6;
    }
    local_e0._8_8_ = plVar6[1];
    *plVar6 = (long)pCVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append(local_e0);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      local_1d0._16_8_ = *psVar9;
      local_1d0._24_8_ = plVar6[3];
      local_1d0._0_8_ = pcVar1;
    }
    else {
      local_1d0._16_8_ = *psVar9;
      local_1d0._0_8_ = (size_type *)*plVar6;
    }
    local_1d0._8_8_ = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1d0._0_8_);
    if ((pointer)local_1d0._0_8_ != pcVar1) {
      operator_delete((void *)local_1d0._0_8_);
    }
    if ((ColumnDataCollection *)local_e0._0_8_ != (ColumnDataCollection *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_120.type_._0_8_ != pp_Var2) {
      operator_delete((void *)local_120.type_._0_8_);
    }
    pCVar7 = Collection(this);
    local_218 = ColumnDataCollection::Rows(pCVar7);
    ColumnDataRowIterationHelper::begin((ColumnDataRowIterator *)local_1d0,&local_218);
    ColumnDataRowIterationHelper::end((ColumnDataRowIterator *)local_e0,&local_218);
    while( true ) {
      bVar4 = ColumnDataRowIterationHelper::ColumnDataRowIterator::operator!=
                        ((ColumnDataRowIterator *)local_1d0,(ColumnDataRowIterator *)local_e0);
      if (!bVar4) break;
      this_00 = ColumnDataRowIterationHelper::ColumnDataRowIterator::operator*
                          ((ColumnDataRowIterator *)local_1d0);
      if ((pCVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pCVar7->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        column_index = 0;
        do {
          if (column_index != 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          ColumnDataRow::GetValue(&local_120,this_00,column_index);
          bVar4 = local_120.is_null;
          if (local_120.is_null == true) {
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"NULL","");
          }
          else {
            Value::ToString_abi_cxx11_(&local_1f0,&local_120);
            local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
            local_240.field_2._M_allocated_capacity._0_2_ = 0;
            local_240._M_string_length = 1;
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\\0","");
            StringUtil::Replace(&local_260,&local_1f0,&local_240,&local_210);
          }
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_260._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (bVar4 == false) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
          }
          Value::~Value(&local_120);
          column_index = column_index + 1;
        } while (column_index <
                 (ulong)(((long)(pCVar7->types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar7->types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555));
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ColumnDataRowIterationHelper::ColumnDataRowIterator::operator++
                ((ColumnDataRowIterator *)local_1d0);
    }
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
    }
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_e0 + 8));
    if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
    }
    if (local_160 != (pointer)0x0) {
      operator_delete(local_160);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_1d0 + 8));
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    pcVar1 = (this->super_QueryResult).super_BaseQueryResult.error.final_message._M_dataplus._M_p;
    local_1d0._0_8_ = local_1d0 + 0x10;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d0,pcVar1,
               pcVar1 + (this->super_QueryResult).super_BaseQueryResult.error.final_message.
                        _M_string_length);
    ::std::__cxx11::string::append(local_1d0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string MaterializedQueryResult::ToString() {
	string result;
	if (success) {
		result = HeaderToString();
		result += "[ Rows: " + to_string(collection->Count()) + "]\n";
		auto &coll = Collection();
		for (auto &row : coll.Rows()) {
			for (idx_t col_idx = 0; col_idx < coll.ColumnCount(); col_idx++) {
				if (col_idx > 0) {
					result += "\t";
				}
				auto val = row.GetValue(col_idx);
				result += val.IsNull() ? "NULL" : StringUtil::Replace(val.ToString(), string("\0", 1), "\\0");
			}
			result += "\n";
		}
		result += "\n";
	} else {
		result = GetError() + "\n";
	}
	return result;
}